

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

void __thiscall
spvtools::opt::SpreadVolatileSemantics::SetVolatileForLoadsInEntries
          (SpreadVolatileSemantics *this,Instruction *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *entry_function_ids)

{
  uint32_t var_id;
  __node_base *p_Var1;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  funcs;
  
  p_Var1 = &(entry_function_ids->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    funcs._M_h._M_bucket_count = 1;
    funcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    funcs._M_h._M_element_count = 0;
    funcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    funcs._M_h._M_rehash_policy._M_next_resize = 0;
    funcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    funcs._M_h._M_buckets = &funcs._M_h._M_single_bucket;
    IRContext::CollectCallTreeFromRoots
              ((this->super_Pass).context_,(uint)*(size_type *)(p_Var1 + 1),
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&funcs._M_h);
    var_id = Instruction::result_id(var);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:252:9)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:252:9)>
               ::_M_manager;
    VisitLoadsOfPointersToVariableInEntries
              (this,var_id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&funcs._M_h);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&funcs._M_h);
  }
  return;
}

Assistant:

void SpreadVolatileSemantics::SetVolatileForLoadsInEntries(
    Instruction* var, const std::unordered_set<uint32_t>& entry_function_ids) {
  // Set Volatile memory operand for all load instructions if they do not have
  // it.
  for (auto entry_id : entry_function_ids) {
    std::unordered_set<uint32_t> funcs;
    context()->CollectCallTreeFromRoots(entry_id, &funcs);
    VisitLoadsOfPointersToVariableInEntries(
        var->result_id(),
        [](Instruction* load) {
          if (load->NumInOperands() <= kOpLoadInOperandMemoryOperands) {
            load->AddOperand({SPV_OPERAND_TYPE_MEMORY_ACCESS,
                              {uint32_t(spv::MemoryAccessMask::Volatile)}});
            return true;
          }
          uint32_t memory_operands =
              load->GetSingleWordInOperand(kOpLoadInOperandMemoryOperands);
          memory_operands |= uint32_t(spv::MemoryAccessMask::Volatile);
          load->SetInOperand(kOpLoadInOperandMemoryOperands, {memory_operands});
          return true;
        },
        funcs);
  }
}